

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

int Mio_LibraryHasProfile(Mio_Library_t *pLib)

{
  int iVar1;
  Mio_Gate_t *pGate;
  
  pGate = Mio_LibraryReadGates(pLib);
  while( true ) {
    if (pGate == (Mio_Gate_t *)0x0) {
      return 0;
    }
    iVar1 = Mio_GateReadProfile(pGate);
    if (0 < iVar1) break;
    pGate = Mio_GateReadNext(pGate);
  }
  return 1;
}

Assistant:

int Mio_LibraryHasProfile( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;    
    Mio_LibraryForEachGate( pLib, pGate )
        if ( Mio_GateReadProfile(pGate) > 0 )
            return 1;
    return 0;
}